

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

xmlNodePtr xmlStaticCopyNodeList(xmlNodePtr node,xmlDocPtr doc,xmlNodePtr parent)

{
  xmlDtdPtr cur;
  xmlDtdPtr cur_00;
  xmlDtdPtr dtd;
  xmlDtdPtr pxVar1;
  
  if (node == (xmlNodePtr)0x0) {
LAB_00185d2b:
    cur_00 = (xmlDtdPtr)0x0;
  }
  else {
    pxVar1 = (xmlDtdPtr)0x0;
    cur_00 = (xmlDtdPtr)0x0;
    dtd = (xmlDtdPtr)node;
    do {
      while (((xmlDtdPtr)node)->type != XML_DTD_NODE) {
        cur = (xmlDtdPtr)xmlStaticCopyNode(node,doc,parent,1);
LAB_00185cf1:
        if (cur == (xmlDtdPtr)0x0) goto LAB_00185d23;
        if (cur_00 == (xmlDtdPtr)0x0) {
          pxVar1 = (xmlDtdPtr)0x0;
          cur_00 = cur;
LAB_00185d0c:
          cur->prev = (_xmlNode *)pxVar1;
          pxVar1 = cur;
        }
        else if (pxVar1 != cur) {
          pxVar1->next = (_xmlNode *)cur;
          goto LAB_00185d0c;
        }
        node = ((xmlDtdPtr)node)->next;
        dtd = (xmlDtdPtr)node;
        if ((xmlDtdPtr)node == (xmlDtdPtr)0x0) {
          return (xmlNodePtr)cur_00;
        }
      }
      if (doc != (xmlDocPtr)0x0) {
        cur = doc->intSubset;
        if (cur != (xmlDtdPtr)0x0) {
LAB_00185ce9:
          xmlAddChild(parent,(xmlNodePtr)cur);
          node = (xmlNodePtr)dtd;
          goto LAB_00185cf1;
        }
        cur = xmlCopyDtd(dtd);
        if (cur != (xmlDtdPtr)0x0) {
          cur->doc = doc;
          cur->parent = (_xmlDoc *)parent;
          doc->intSubset = cur;
          goto LAB_00185ce9;
        }
LAB_00185d23:
        xmlFreeNodeList((xmlNodePtr)cur_00);
        goto LAB_00185d2b;
      }
      node = ((xmlDtdPtr)node)->next;
    } while ((xmlDtdPtr)node != (xmlDtdPtr)0x0);
  }
  return (xmlNodePtr)cur_00;
}

Assistant:

xmlNodePtr
xmlStaticCopyNodeList(xmlNodePtr node, xmlDocPtr doc, xmlNodePtr parent) {
    xmlNodePtr ret = NULL;
    xmlNodePtr p = NULL,q;

    while (node != NULL) {
#ifdef LIBXML_TREE_ENABLED
	if (node->type == XML_DTD_NODE ) {
	    if (doc == NULL) {
		node = node->next;
		continue;
	    }
	    if (doc->intSubset == NULL) {
		q = (xmlNodePtr) xmlCopyDtd( (xmlDtdPtr) node );
		if (q == NULL) goto error;
		q->doc = doc;
		q->parent = parent;
		doc->intSubset = (xmlDtdPtr) q;
		xmlAddChild(parent, q);
	    } else {
		q = (xmlNodePtr) doc->intSubset;
		xmlAddChild(parent, q);
	    }
	} else
#endif /* LIBXML_TREE_ENABLED */
	    q = xmlStaticCopyNode(node, doc, parent, 1);
	if (q == NULL) goto error;
	if (ret == NULL) {
	    q->prev = NULL;
	    ret = p = q;
	} else if (p != q) {
	/* the test is required if xmlStaticCopyNode coalesced 2 text nodes */
	    p->next = q;
	    q->prev = p;
	    p = q;
	}
	node = node->next;
    }
    return(ret);
error:
    xmlFreeNodeList(ret);
    return(NULL);
}